

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conelinei_intersector.h
# Opt level: O2

void embree::avx::ConeCurveMiMBIntersectorK<4,_8,_true>::intersect
               (Precalculations *pre,RayHitK<8> *ray,size_t k,RayQueryContext *context,
               Primitive *line)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  Geometry *pGVar5;
  long lVar6;
  long lVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined4 uVar21;
  undefined4 uVar22;
  RayHitK<8> *pRVar23;
  uint uVar25;
  Scene *pSVar26;
  undefined1 (*pauVar27) [16];
  long lVar28;
  long lVar29;
  float fVar30;
  float fVar31;
  float fVar41;
  float fVar43;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  float fVar44;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  float fVar42;
  undefined1 auVar38 [16];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  float fVar45;
  float fVar46;
  float fVar55;
  float fVar57;
  float fVar58;
  undefined1 auVar47 [16];
  float fVar56;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  float fVar74;
  float fVar79;
  float fVar80;
  undefined1 auVar75 [16];
  float fVar81;
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  float fVar82;
  float fVar90;
  float fVar91;
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [64];
  float fVar92;
  float fVar103;
  float fVar104;
  undefined1 auVar93 [16];
  float fVar105;
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [64];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [64];
  float fVar122;
  float fVar128;
  float fVar129;
  undefined1 auVar123 [16];
  float fVar130;
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  float fVar131;
  float fVar139;
  float fVar140;
  undefined1 auVar132 [16];
  float fVar141;
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [64];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [64];
  float fVar146;
  float fVar149;
  float fVar150;
  undefined1 auVar147 [16];
  float fVar151;
  undefined1 auVar148 [16];
  float fVar152;
  float fVar157;
  float fVar158;
  undefined1 auVar153 [16];
  float fVar159;
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [64];
  float fVar162;
  undefined1 auVar160 [16];
  undefined1 auVar161 [64];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  vbool<4> valid;
  RTCFilterFunctionNArguments args;
  RoundLineIntersectorHitM<4> hit;
  undefined1 local_480 [8];
  float fStack_478;
  float fStack_474;
  undefined1 local_460 [16];
  RayQueryContext *local_448;
  undefined1 (*local_440) [16];
  float fStack_438;
  float fStack_434;
  undefined1 local_430 [16];
  undefined1 local_420 [16];
  undefined1 local_410 [16];
  undefined1 local_3f0 [16];
  undefined1 local_3e0 [8];
  float fStack_3d8;
  float fStack_3d4;
  undefined1 local_3d0 [8];
  float fStack_3c8;
  float fStack_3c4;
  Scene *local_3c0;
  RayHitK<8> *local_3b8;
  undefined1 local_3b0 [16];
  undefined1 *local_3a0;
  void *local_398;
  RTCRayQueryContext *local_390;
  RayHitK<8> *local_388;
  undefined1 (*local_380) [32];
  undefined4 local_378;
  undefined1 local_370 [16];
  undefined1 local_360 [16];
  undefined1 local_350 [16];
  undefined1 local_340 [16];
  undefined1 local_330 [16];
  undefined1 local_320 [16];
  undefined1 local_310 [16];
  undefined1 local_300 [16];
  undefined1 local_2f0 [16];
  undefined1 local_2e0 [16];
  float local_2d0;
  float fStack_2cc;
  float fStack_2c8;
  float fStack_2c4;
  undefined1 local_2c0 [16];
  undefined1 local_2b0 [16];
  float local_2a0;
  float fStack_29c;
  float fStack_298;
  float fStack_294;
  undefined1 local_290 [8];
  float fStack_288;
  float fStack_284;
  float local_280;
  float fStack_27c;
  float fStack_278;
  float fStack_274;
  float local_270;
  float fStack_26c;
  float fStack_268;
  float fStack_264;
  undefined1 local_260 [16];
  undefined1 local_250 [8];
  float fStack_248;
  float fStack_244;
  float local_240;
  float fStack_23c;
  float fStack_238;
  float fStack_234;
  undefined1 local_230 [8];
  float fStack_228;
  float fStack_224;
  undefined1 local_220 [16];
  undefined1 local_210 [16];
  undefined1 local_200 [16];
  undefined1 local_1f0 [16];
  undefined1 local_1e0 [16];
  float local_1d0;
  float fStack_1cc;
  float fStack_1c8;
  float fStack_1c4;
  float local_1c0;
  float fStack_1bc;
  float fStack_1b8;
  float fStack_1b4;
  float local_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  float local_1a0;
  float fStack_19c;
  float fStack_198;
  float fStack_194;
  undefined1 local_190 [16];
  undefined1 local_180 [32];
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  undefined4 local_120;
  undefined4 uStack_11c;
  undefined4 uStack_118;
  undefined4 uStack_114;
  undefined4 uStack_110;
  undefined4 uStack_10c;
  undefined4 uStack_108;
  undefined4 uStack_104;
  undefined4 local_100;
  undefined4 uStack_fc;
  undefined4 uStack_f8;
  undefined4 uStack_f4;
  undefined4 uStack_f0;
  undefined4 uStack_ec;
  undefined4 uStack_e8;
  undefined4 uStack_e4;
  uint local_e0;
  uint uStack_dc;
  uint uStack_d8;
  uint uStack_d4;
  uint uStack_d0;
  uint uStack_cc;
  uint uStack_c8;
  uint uStack_c4;
  undefined1 local_c0 [16];
  undefined1 auStack_b0 [16];
  uint local_a0;
  uint uStack_9c;
  uint uStack_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  uint uStack_88;
  uint uStack_84;
  uint local_80;
  uint uStack_7c;
  uint uStack_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  uint uStack_68;
  uint uStack_64;
  ulong uVar24;
  undefined1 auVar102 [64];
  
  pSVar26 = context->scene;
  uVar25 = line->sharedGeomID;
  uVar1 = (line->v0).field_0.i[0];
  pGVar5 = (pSVar26->geometries).items[uVar25].ptr;
  fVar82 = (pGVar5->time_range).lower;
  fVar82 = pGVar5->fnumTimeSegments *
           ((*(float *)(ray + k * 4 + 0xe0) - fVar82) / ((pGVar5->time_range).upper - fVar82));
  auVar33 = vroundss_avx(ZEXT416((uint)fVar82),ZEXT416((uint)fVar82),9);
  auVar33 = vminss_avx(auVar33,ZEXT416((uint)(pGVar5->fnumTimeSegments + -1.0)));
  auVar83 = vmaxss_avx(ZEXT816(0),auVar33);
  lVar28 = *(long *)&pGVar5[3].time_range.upper;
  lVar29 = (long)(int)auVar83._0_4_ * 0x38;
  lVar6 = *(long *)(lVar28 + lVar29);
  lVar7 = *(long *)(lVar28 + 0x10 + lVar29);
  auVar33 = *(undefined1 (*) [16])(lVar6 + lVar7 * (ulong)uVar1);
  uVar2 = (line->v0).field_0.i[1];
  auVar36 = *(undefined1 (*) [16])(lVar6 + lVar7 * (ulong)uVar2);
  uVar3 = (line->v0).field_0.i[2];
  auVar69 = *(undefined1 (*) [16])(lVar6 + lVar7 * (ulong)uVar3);
  uVar4 = (line->v0).field_0.i[3];
  auVar34 = *(undefined1 (*) [16])(lVar6 + lVar7 * (ulong)uVar4);
  auVar47 = *(undefined1 (*) [16])(lVar6 + lVar7 * (ulong)(uVar1 + 1));
  auVar59 = *(undefined1 (*) [16])(lVar6 + lVar7 * (ulong)(uVar2 + 1));
  auVar32 = *(undefined1 (*) [16])(lVar6 + lVar7 * (ulong)(uVar3 + 1));
  auVar48 = *(undefined1 (*) [16])(lVar6 + lVar7 * (ulong)(uVar4 + 1));
  lVar6 = *(long *)(lVar28 + 0x38 + lVar29);
  lVar28 = *(long *)(lVar28 + 0x48 + lVar29);
  auVar60 = *(undefined1 (*) [16])(lVar6 + (ulong)uVar1 * lVar28);
  auVar61 = *(undefined1 (*) [16])(lVar6 + (ulong)uVar2 * lVar28);
  auVar62 = *(undefined1 (*) [16])(lVar6 + (ulong)uVar3 * lVar28);
  auVar70 = *(undefined1 (*) [16])(lVar6 + (ulong)uVar4 * lVar28);
  auVar71 = *(undefined1 (*) [16])(lVar6 + (ulong)(uVar1 + 1) * lVar28);
  auVar75 = *(undefined1 (*) [16])(lVar6 + (ulong)(uVar3 + 1) * lVar28);
  fVar82 = fVar82 - auVar83._0_4_;
  auVar83 = vunpcklps_avx(auVar33,auVar69);
  auVar33 = vunpckhps_avx(auVar33,auVar69);
  auVar69 = vunpcklps_avx(auVar36,auVar34);
  auVar36 = vunpckhps_avx(auVar36,auVar34);
  auVar93 = vunpcklps_avx(auVar83,auVar69);
  auVar69 = vunpckhps_avx(auVar83,auVar69);
  auVar83 = vunpcklps_avx(auVar33,auVar36);
  auVar34 = vunpckhps_avx(auVar33,auVar36);
  auVar106 = vunpcklps_avx(auVar47,auVar32);
  auVar33 = vunpckhps_avx(auVar47,auVar32);
  auVar47 = vunpcklps_avx(auVar59,auVar48);
  auVar36 = vunpckhps_avx(auVar59,auVar48);
  auVar107 = vunpcklps_avx(auVar106,auVar47);
  auVar47 = vunpckhps_avx(auVar106,auVar47);
  auVar106 = vunpcklps_avx(auVar33,auVar36);
  auVar59 = vunpckhps_avx(auVar33,auVar36);
  auVar32 = vunpcklps_avx(auVar60,auVar62);
  auVar33 = vunpckhps_avx(auVar60,auVar62);
  auVar48 = vunpcklps_avx(auVar61,auVar70);
  auVar36 = vunpckhps_avx(auVar61,auVar70);
  auVar62 = vunpcklps_avx(auVar32,auVar48);
  auVar32 = vunpckhps_avx(auVar32,auVar48);
  auVar70 = vunpcklps_avx(auVar33,auVar36);
  auVar48 = vunpckhps_avx(auVar33,auVar36);
  auVar61 = vunpcklps_avx(auVar71,auVar75);
  auVar60 = vunpckhps_avx(auVar71,auVar75);
  auVar33 = *(undefined1 (*) [16])(lVar6 + (ulong)(uVar2 + 1) * lVar28);
  auVar36 = *(undefined1 (*) [16])(lVar6 + lVar28 * (ulong)(uVar4 + 1));
  auVar71 = vunpcklps_avx(auVar33,auVar36);
  auVar33 = vunpckhps_avx(auVar33,auVar36);
  auVar75 = vunpcklps_avx(auVar61,auVar71);
  auVar61 = vunpckhps_avx(auVar61,auVar71);
  auVar71 = vunpcklps_avx(auVar60,auVar33);
  auVar60 = vunpckhps_avx(auVar60,auVar33);
  auVar33 = vshufps_avx(ZEXT416((uint)fVar82),ZEXT416((uint)fVar82),0);
  auVar36 = vshufps_avx(ZEXT416((uint)(1.0 - fVar82)),ZEXT416((uint)(1.0 - fVar82)),0);
  fVar55 = auVar33._0_4_;
  fVar57 = auVar33._4_4_;
  fVar58 = auVar33._8_4_;
  fVar162 = auVar33._12_4_;
  local_480._0_4_ = auVar93._0_4_;
  local_480._4_4_ = auVar93._4_4_;
  fStack_478 = auVar93._8_4_;
  fStack_474 = auVar93._12_4_;
  fVar82 = auVar36._0_4_;
  fVar90 = auVar36._4_4_;
  fVar91 = auVar36._8_4_;
  fVar45 = auVar36._12_4_;
  auVar153._0_4_ = fVar82 * (float)local_480._0_4_ + fVar55 * auVar62._0_4_;
  auVar153._4_4_ = fVar90 * (float)local_480._4_4_ + fVar57 * auVar62._4_4_;
  auVar153._8_4_ = fVar91 * fStack_478 + fVar58 * auVar62._8_4_;
  auVar153._12_4_ = fVar45 * fStack_474 + fVar162 * auVar62._12_4_;
  auVar93._0_4_ = auVar69._0_4_ * fVar82 + fVar55 * auVar32._0_4_;
  auVar93._4_4_ = auVar69._4_4_ * fVar90 + fVar57 * auVar32._4_4_;
  auVar93._8_4_ = auVar69._8_4_ * fVar91 + fVar58 * auVar32._8_4_;
  auVar93._12_4_ = auVar69._12_4_ * fVar45 + fVar162 * auVar32._12_4_;
  auVar142._0_4_ = auVar83._0_4_ * fVar82 + fVar55 * auVar70._0_4_;
  auVar142._4_4_ = auVar83._4_4_ * fVar90 + fVar57 * auVar70._4_4_;
  auVar142._8_4_ = auVar83._8_4_ * fVar91 + fVar58 * auVar70._8_4_;
  auVar142._12_4_ = auVar83._12_4_ * fVar45 + fVar162 * auVar70._12_4_;
  auVar163._8_4_ = 0x3f800000;
  auVar163._0_8_ = 0x3f8000003f800000;
  auVar163._12_4_ = 0x3f800000;
  local_480._0_4_ = fVar82 * auVar34._0_4_ + fVar55 * auVar48._0_4_;
  local_480._4_4_ = fVar90 * auVar34._4_4_ + fVar57 * auVar48._4_4_;
  fStack_478 = fVar91 * auVar34._8_4_ + fVar58 * auVar48._8_4_;
  fStack_474 = fVar45 * auVar34._12_4_ + fVar162 * auVar48._12_4_;
  auVar132._0_4_ = auVar107._0_4_ * fVar82 + fVar55 * auVar75._0_4_;
  auVar132._4_4_ = auVar107._4_4_ * fVar90 + fVar57 * auVar75._4_4_;
  auVar132._8_4_ = auVar107._8_4_ * fVar91 + fVar58 * auVar75._8_4_;
  auVar132._12_4_ = auVar107._12_4_ * fVar45 + fVar162 * auVar75._12_4_;
  auVar147._0_4_ = auVar47._0_4_ * fVar82 + fVar55 * auVar61._0_4_;
  auVar147._4_4_ = auVar47._4_4_ * fVar90 + fVar57 * auVar61._4_4_;
  auVar147._8_4_ = auVar47._8_4_ * fVar91 + fVar58 * auVar61._8_4_;
  auVar147._12_4_ = auVar47._12_4_ * fVar45 + fVar162 * auVar61._12_4_;
  local_3e0._0_4_ = auVar106._0_4_;
  local_3e0._4_4_ = auVar106._4_4_;
  fStack_3d8 = auVar106._8_4_;
  fStack_3d4 = auVar106._12_4_;
  auVar123._0_4_ = fVar82 * (float)local_3e0._0_4_ + fVar55 * auVar71._0_4_;
  auVar123._4_4_ = fVar90 * (float)local_3e0._4_4_ + fVar57 * auVar71._4_4_;
  auVar123._8_4_ = fVar91 * fStack_3d8 + fVar58 * auVar71._8_4_;
  auVar123._12_4_ = fVar45 * fStack_3d4 + fVar162 * auVar71._12_4_;
  local_3d0._0_4_ = auVar59._0_4_;
  local_3d0._4_4_ = auVar59._4_4_;
  fStack_3c8 = auVar59._8_4_;
  fStack_3c4 = auVar59._12_4_;
  auVar32._0_4_ = fVar82 * (float)local_3d0._0_4_ + fVar55 * auVar60._0_4_;
  auVar32._4_4_ = fVar90 * (float)local_3d0._4_4_ + fVar57 * auVar60._4_4_;
  auVar32._8_4_ = fVar91 * fStack_3c8 + fVar58 * auVar60._8_4_;
  auVar32._12_4_ = fVar45 * fStack_3c4 + fVar162 * auVar60._12_4_;
  auVar33 = vpcmpeqd_avx(auVar32,auVar32);
  auVar36 = vpcmpeqd_avx(auVar33,(undefined1  [16])(line->primIDs).field_0);
  local_220 = vshufps_avx(ZEXT416(uVar25),ZEXT416(uVar25),0);
  local_3d0._4_4_ = *(undefined4 *)(ray + k * 4 + 0x80);
  local_240 = *(float *)(ray + k * 4 + 0xa0);
  local_2a0 = *(float *)(ray + k * 4 + 0xc0);
  auVar33 = ZEXT416((uint)((float)local_3d0._4_4_ * (float)local_3d0._4_4_ +
                          local_240 * local_240 + local_2a0 * local_2a0));
  auVar69 = vshufps_avx(auVar33,auVar33,0);
  auVar33 = vrcpps_avx(auVar69);
  fVar45 = auVar33._0_4_;
  auVar34._0_4_ = fVar45 * auVar69._0_4_;
  fVar55 = auVar33._4_4_;
  auVar34._4_4_ = fVar55 * auVar69._4_4_;
  fVar57 = auVar33._8_4_;
  auVar34._8_4_ = fVar57 * auVar69._8_4_;
  fVar58 = auVar33._12_4_;
  auVar34._12_4_ = fVar58 * auVar69._12_4_;
  auVar33 = vsubps_avx(auVar163,auVar34);
  auVar47._0_4_ = (auVar153._0_4_ + auVar132._0_4_) * 0.5;
  auVar47._4_4_ = (auVar153._4_4_ + auVar132._4_4_) * 0.5;
  auVar47._8_4_ = (auVar153._8_4_ + auVar132._8_4_) * 0.5;
  auVar47._12_4_ = (auVar153._12_4_ + auVar132._12_4_) * 0.5;
  auVar69._0_4_ = (auVar147._0_4_ + auVar93._0_4_) * 0.5;
  auVar69._4_4_ = (auVar147._4_4_ + auVar93._4_4_) * 0.5;
  auVar69._8_4_ = (auVar147._8_4_ + auVar93._8_4_) * 0.5;
  auVar69._12_4_ = (auVar147._12_4_ + auVar93._12_4_) * 0.5;
  auVar59._0_4_ = (auVar142._0_4_ + auVar123._0_4_) * 0.5;
  auVar59._4_4_ = (auVar142._4_4_ + auVar123._4_4_) * 0.5;
  auVar59._8_4_ = (auVar142._8_4_ + auVar123._8_4_) * 0.5;
  auVar59._12_4_ = (auVar142._12_4_ + auVar123._12_4_) * 0.5;
  fVar82 = *(float *)(ray + k * 4 + 0x20);
  auVar75._4_4_ = fVar82;
  auVar75._0_4_ = fVar82;
  auVar75._8_4_ = fVar82;
  auVar75._12_4_ = fVar82;
  auVar69 = vsubps_avx(auVar69,auVar75);
  fVar90 = *(float *)(ray + k * 4 + 0x40);
  auVar83._4_4_ = fVar90;
  auVar83._0_4_ = fVar90;
  auVar83._8_4_ = fVar90;
  auVar83._12_4_ = fVar90;
  auVar34 = vsubps_avx(auVar59,auVar83);
  fVar91 = *(float *)(ray + k * 4);
  auVar70._4_4_ = fVar91;
  auVar70._0_4_ = fVar91;
  auVar70._8_4_ = fVar91;
  auVar70._12_4_ = fVar91;
  auVar47 = vsubps_avx(auVar47,auVar70);
  fVar46 = (auVar47._0_4_ * (float)local_3d0._4_4_ +
           local_240 * auVar69._0_4_ + local_2a0 * auVar34._0_4_) *
           (fVar45 + fVar45 * auVar33._0_4_);
  fVar56 = (auVar47._4_4_ * (float)local_3d0._4_4_ +
           local_240 * auVar69._4_4_ + local_2a0 * auVar34._4_4_) *
           (fVar55 + fVar55 * auVar33._4_4_);
  fStack_438 = (auVar47._8_4_ * (float)local_3d0._4_4_ +
               local_240 * auVar69._8_4_ + local_2a0 * auVar34._8_4_) *
               (fVar57 + fVar57 * auVar33._8_4_);
  fStack_434 = (auVar47._12_4_ * (float)local_3d0._4_4_ +
               local_240 * auVar69._12_4_ + local_2a0 * auVar34._12_4_) *
               (fVar58 + fVar58 * auVar33._12_4_);
  auVar60._0_4_ = fVar91 + (float)local_3d0._4_4_ * fVar46;
  auVar60._4_4_ = fVar91 + (float)local_3d0._4_4_ * fVar56;
  auVar60._8_4_ = fVar91 + (float)local_3d0._4_4_ * fStack_438;
  auVar60._12_4_ = fVar91 + (float)local_3d0._4_4_ * fStack_434;
  auVar71._0_4_ = fVar82 + local_240 * fVar46;
  auVar71._4_4_ = fVar82 + local_240 * fVar56;
  auVar71._8_4_ = fVar82 + local_240 * fStack_438;
  auVar71._12_4_ = fVar82 + local_240 * fStack_434;
  auVar164._0_4_ = fVar90 + local_2a0 * fVar46;
  auVar164._4_4_ = fVar90 + local_2a0 * fVar56;
  auVar164._8_4_ = fVar90 + local_2a0 * fStack_438;
  auVar164._12_4_ = fVar90 + local_2a0 * fStack_434;
  local_260 = vsubps_avx(auVar147,auVar93);
  local_2b0 = vsubps_avx(auVar123,auVar142);
  fVar82 = local_2b0._0_4_;
  fVar57 = local_2b0._4_4_;
  fVar10 = local_2b0._8_4_;
  fVar14 = local_2b0._12_4_;
  fVar90 = local_260._0_4_;
  fVar58 = local_260._4_4_;
  fVar11 = local_260._8_4_;
  fVar15 = local_260._12_4_;
  auVar69 = vsubps_avx(auVar132,auVar153);
  fVar91 = auVar69._0_4_;
  fVar162 = auVar69._4_4_;
  fVar12 = auVar69._8_4_;
  fVar16 = auVar69._12_4_;
  fVar30 = fVar91 * fVar91 + fVar90 * fVar90 + fVar82 * fVar82;
  fVar41 = fVar162 * fVar162 + fVar58 * fVar58 + fVar57 * fVar57;
  fVar43 = fVar12 * fVar12 + fVar11 * fVar11 + fVar10 * fVar10;
  fVar44 = fVar16 * fVar16 + fVar15 * fVar15 + fVar14 * fVar14;
  _local_3e0 = vsubps_avx(auVar71,auVar93);
  local_2c0 = vsubps_avx(auVar164,auVar142);
  fVar131 = local_2c0._0_4_;
  fVar139 = local_2c0._4_4_;
  fVar140 = local_2c0._8_4_;
  fVar141 = local_2c0._12_4_;
  fVar45 = local_3e0._0_4_;
  fVar8 = local_3e0._4_4_;
  fVar13 = local_3e0._8_4_;
  fVar17 = local_3e0._12_4_;
  _local_250 = vsubps_avx(auVar60,auVar153);
  fVar152 = local_250._0_4_;
  fVar157 = local_250._4_4_;
  fVar158 = local_250._8_4_;
  fVar159 = local_250._12_4_;
  fVar146 = fVar152 * fVar91 + fVar90 * fVar45 + fVar131 * fVar82;
  fVar149 = fVar157 * fVar162 + fVar58 * fVar8 + fVar139 * fVar57;
  fVar150 = fVar158 * fVar12 + fVar11 * fVar13 + fVar140 * fVar10;
  fVar151 = fVar159 * fVar16 + fVar15 * fVar17 + fVar141 * fVar14;
  auVar143._0_4_ = fVar91 * (float)local_3d0._4_4_ + local_240 * fVar90 + local_2a0 * fVar82;
  auVar143._4_4_ = fVar162 * (float)local_3d0._4_4_ + local_240 * fVar58 + local_2a0 * fVar57;
  auVar143._8_4_ = fVar12 * (float)local_3d0._4_4_ + local_240 * fVar11 + local_2a0 * fVar10;
  auVar143._12_4_ = fVar16 * (float)local_3d0._4_4_ + local_240 * fVar15 + local_2a0 * fVar14;
  fStack_29c = local_2a0;
  fStack_298 = local_2a0;
  fStack_294 = local_2a0;
  fStack_23c = local_240;
  fStack_238 = local_240;
  fStack_234 = local_240;
  local_3d0._0_4_ = local_3d0._4_4_;
  fStack_3c8 = (float)local_3d0._4_4_;
  fStack_3c4 = (float)local_3d0._4_4_;
  auVar33 = vsubps_avx(_local_480,auVar32);
  fVar55 = auVar33._0_4_;
  fVar9 = auVar33._4_4_;
  fVar31 = auVar33._8_4_;
  fVar42 = auVar33._12_4_;
  fVar74 = fVar55 * fVar55 + fVar30;
  fVar79 = fVar9 * fVar9 + fVar41;
  fVar80 = fVar31 * fVar31 + fVar43;
  fVar81 = fVar42 * fVar42 + fVar44;
  local_230._0_4_ = fVar30 * fVar30;
  local_230._4_4_ = fVar41 * fVar41;
  fStack_228 = fVar43 * fVar43;
  fStack_224 = fVar44 * fVar44;
  auVar33._0_4_ =
       (float)local_230._0_4_ *
       (fVar152 * (float)local_3d0._4_4_ + local_240 * fVar45 + local_2a0 * fVar131);
  auVar33._4_4_ =
       (float)local_230._4_4_ *
       (fVar157 * (float)local_3d0._4_4_ + local_240 * fVar8 + local_2a0 * fVar139);
  auVar33._8_4_ =
       fStack_228 * (fVar158 * (float)local_3d0._4_4_ + local_240 * fVar13 + local_2a0 * fVar140);
  auVar33._12_4_ =
       fStack_224 * (fVar159 * (float)local_3d0._4_4_ + local_240 * fVar17 + local_2a0 * fVar141);
  auVar106._0_4_ = fVar74 * auVar143._0_4_ * fVar146;
  auVar106._4_4_ = fVar79 * auVar143._4_4_ * fVar149;
  auVar106._8_4_ = fVar80 * auVar143._8_4_ * fVar150;
  auVar106._12_4_ = fVar81 * auVar143._12_4_ * fVar151;
  auVar33 = vsubps_avx(auVar33,auVar106);
  auVar107._0_4_ = (float)local_480._0_4_ * fVar30;
  auVar107._4_4_ = (float)local_480._4_4_ * fVar41;
  auVar107._8_4_ = fStack_478 * fVar43;
  auVar107._12_4_ = fStack_474 * fVar44;
  auVar48._0_4_ = auVar143._0_4_ * fVar55 * auVar107._0_4_ + auVar33._0_4_;
  auVar48._4_4_ = auVar143._4_4_ * fVar9 * auVar107._4_4_ + auVar33._4_4_;
  auVar48._8_4_ = auVar143._8_4_ * fVar31 * auVar107._8_4_ + auVar33._8_4_;
  auVar48._12_4_ = auVar143._12_4_ * fVar42 * auVar107._12_4_ + auVar33._12_4_;
  auVar61._0_4_ = (float)local_230._0_4_ * (fVar152 * fVar152 + fVar45 * fVar45 + fVar131 * fVar131)
  ;
  auVar61._4_4_ = (float)local_230._4_4_ * (fVar157 * fVar157 + fVar8 * fVar8 + fVar139 * fVar139);
  auVar61._8_4_ = fStack_228 * (fVar158 * fVar158 + fVar13 * fVar13 + fVar140 * fVar140);
  auVar61._12_4_ = fStack_224 * (fVar159 * fVar159 + fVar17 * fVar17 + fVar141 * fVar141);
  auVar117._0_4_ = fVar146 * fVar146 * fVar74;
  auVar117._4_4_ = fVar149 * fVar149 * fVar79;
  auVar117._8_4_ = fVar150 * fVar150 * fVar80;
  auVar117._12_4_ = fVar151 * fVar151 * fVar81;
  auVar33 = vsubps_avx(auVar61,auVar117);
  auVar118._0_4_ = (fVar55 + fVar55) * fVar146;
  auVar118._4_4_ = (fVar9 + fVar9) * fVar149;
  auVar118._8_4_ = (fVar31 + fVar31) * fVar150;
  auVar118._12_4_ = (fVar42 + fVar42) * fVar151;
  auVar34 = vsubps_avx(auVar118,auVar107);
  fVar92 = auVar143._0_4_ * auVar143._0_4_;
  fVar103 = auVar143._4_4_ * auVar143._4_4_;
  fVar104 = auVar143._8_4_ * auVar143._8_4_;
  fVar105 = auVar143._12_4_ * auVar143._12_4_;
  auVar62._0_4_ = fVar74 * fVar92;
  auVar62._4_4_ = fVar79 * fVar103;
  auVar62._8_4_ = fVar80 * fVar104;
  auVar62._12_4_ = fVar81 * fVar105;
  auVar47 = vsubps_avx(_local_230,auVar62);
  auVar108._0_4_ = auVar47._0_4_ * (auVar33._0_4_ + auVar34._0_4_ * auVar107._0_4_);
  auVar108._4_4_ = auVar47._4_4_ * (auVar33._4_4_ + auVar34._4_4_ * auVar107._4_4_);
  auVar108._8_4_ = auVar47._8_4_ * (auVar33._8_4_ + auVar34._8_4_ * auVar107._8_4_);
  auVar108._12_4_ = auVar47._12_4_ * (auVar33._12_4_ + auVar34._12_4_ * auVar107._12_4_);
  auVar119._0_4_ = auVar48._0_4_ * auVar48._0_4_;
  auVar119._4_4_ = auVar48._4_4_ * auVar48._4_4_;
  auVar119._8_4_ = auVar48._8_4_ * auVar48._8_4_;
  auVar119._12_4_ = auVar48._12_4_ * auVar48._12_4_;
  auVar34 = vsubps_avx(auVar119,auVar108);
  auVar61 = ZEXT416(0) << 0x20;
  auVar33 = vcmpps_avx(auVar34,auVar61,5);
  auVar59 = auVar33 & ~auVar36;
  if ((((auVar59 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
       (auVar59 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
      (auVar59 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar59[0xf] < '\0') {
    auVar59 = vandnps_avx(auVar36,auVar33);
    auVar60 = vsubps_avx(auVar60,auVar132);
    auVar62 = vsubps_avx(auVar71,auVar147);
    auVar70 = vsubps_avx(auVar164,auVar123);
    auVar33 = vrcpps_avx(auVar47);
    fVar122 = auVar33._0_4_;
    auVar133._0_4_ = fVar122 * auVar47._0_4_;
    fVar128 = auVar33._4_4_;
    auVar133._4_4_ = fVar128 * auVar47._4_4_;
    fVar129 = auVar33._8_4_;
    auVar133._8_4_ = fVar129 * auVar47._8_4_;
    fVar130 = auVar33._12_4_;
    auVar133._12_4_ = fVar130 * auVar47._12_4_;
    auVar165._8_4_ = 0x3f800000;
    auVar165._0_8_ = 0x3f8000003f800000;
    auVar165._12_4_ = 0x3f800000;
    auVar33 = vsubps_avx(auVar165,auVar133);
    fVar122 = fVar122 + fVar122 * auVar33._0_4_;
    fVar128 = fVar128 + fVar128 * auVar33._4_4_;
    fVar129 = fVar129 + fVar129 * auVar33._8_4_;
    fVar130 = fVar130 + fVar130 * auVar33._12_4_;
    auVar134._8_4_ = 0x7fffffff;
    auVar134._0_8_ = 0x7fffffff7fffffff;
    auVar134._12_4_ = 0x7fffffff;
    auVar33 = vandps_avx(auVar134,auVar47);
    auVar135._8_4_ = 0x219392ef;
    auVar135._0_8_ = 0x219392ef219392ef;
    auVar135._12_4_ = 0x219392ef;
    auVar33 = vcmpps_avx(auVar33,auVar135,2);
    auVar36 = vsqrtps_avx(auVar34);
    uVar24 = CONCAT44(auVar48._4_4_,auVar48._0_4_);
    auVar136._0_8_ = uVar24 ^ 0x8000000080000000;
    auVar136._8_4_ = -auVar48._8_4_;
    auVar136._12_4_ = -auVar48._12_4_;
    auVar34 = vsubps_avx(auVar136,auVar36);
    auVar36 = vsubps_avx(auVar36,auVar48);
    auVar109._0_4_ = auVar34._0_4_ * fVar122;
    auVar109._4_4_ = auVar34._4_4_ * fVar128;
    auVar109._8_4_ = auVar34._8_4_ * fVar129;
    auVar109._12_4_ = auVar34._12_4_ * fVar130;
    auVar49._0_4_ = fVar122 * auVar36._0_4_;
    auVar49._4_4_ = fVar128 * auVar36._4_4_;
    auVar49._8_4_ = fVar129 * auVar36._8_4_;
    auVar49._12_4_ = fVar130 * auVar36._12_4_;
    auVar35._8_4_ = 0xff800000;
    auVar35._0_8_ = 0xff800000ff800000;
    auVar35._12_4_ = 0xff800000;
    auVar36 = vblendvps_avx(auVar109,auVar35,auVar33);
    auVar154._8_4_ = 0x7f800000;
    auVar154._0_8_ = 0x7f8000007f800000;
    auVar154._12_4_ = 0x7f800000;
    auVar34 = vblendvps_avx(auVar49,auVar154,auVar33);
    auVar124._0_4_ = fVar146 + auVar143._0_4_ * auVar36._0_4_;
    auVar124._4_4_ = fVar149 + auVar143._4_4_ * auVar36._4_4_;
    auVar124._8_4_ = fVar150 + auVar143._8_4_ * auVar36._8_4_;
    auVar124._12_4_ = fVar151 + auVar143._12_4_ * auVar36._12_4_;
    auVar33 = vcmpps_avx(auVar124,auVar61,6);
    auVar18._4_4_ = fVar41;
    auVar18._0_4_ = fVar30;
    auVar18._8_4_ = fVar43;
    auVar18._12_4_ = fVar44;
    auVar47 = vcmpps_avx(auVar124,auVar18,1);
    auVar33 = vandps_avx(auVar47,auVar33);
    auVar33 = vandps_avx(auVar59,auVar33);
    local_2e0 = vblendvps_avx(auVar154,auVar36,auVar33);
    auVar155._0_4_ = fVar146 + auVar143._0_4_ * auVar34._0_4_;
    auVar155._4_4_ = fVar149 + auVar143._4_4_ * auVar34._4_4_;
    auVar155._8_4_ = fVar150 + auVar143._8_4_ * auVar34._8_4_;
    auVar155._12_4_ = fVar151 + auVar143._12_4_ * auVar34._12_4_;
    auVar33 = vcmpps_avx(auVar155,auVar61,6);
    auVar36 = vcmpps_avx(auVar155,auVar18,1);
    auVar33 = vandps_avx(auVar36,auVar33);
    auVar33 = vandps_avx(auVar59,auVar33);
    local_3b0 = vblendvps_avx(auVar35,auVar34,auVar33);
    auVar33 = vrcpps_avx(auVar143);
    fVar122 = auVar33._0_4_;
    auVar63._0_4_ = auVar143._0_4_ * fVar122;
    fVar128 = auVar33._4_4_;
    auVar63._4_4_ = auVar143._4_4_ * fVar128;
    fVar129 = auVar33._8_4_;
    auVar63._8_4_ = auVar143._8_4_ * fVar129;
    fVar130 = auVar33._12_4_;
    auVar63._12_4_ = auVar143._12_4_ * fVar130;
    auVar33 = vsubps_avx(auVar165,auVar63);
    fVar122 = fVar122 + fVar122 * auVar33._0_4_;
    fVar128 = fVar128 + fVar128 * auVar33._4_4_;
    fVar129 = fVar129 + fVar129 * auVar33._8_4_;
    fVar130 = fVar130 + fVar130 * auVar33._12_4_;
    auVar64._0_4_ = auVar143._0_4_ * fVar152;
    auVar64._4_4_ = auVar143._4_4_ * fVar157;
    auVar64._8_4_ = auVar143._8_4_ * fVar158;
    auVar64._12_4_ = auVar143._12_4_ * fVar159;
    auVar94._0_4_ = (float)local_3d0._4_4_ * fVar146;
    auVar94._4_4_ = (float)local_3d0._4_4_ * fVar149;
    auVar94._8_4_ = (float)local_3d0._4_4_ * fVar150;
    auVar94._12_4_ = (float)local_3d0._4_4_ * fVar151;
    auVar33 = vsubps_avx(auVar64,auVar94);
    auVar95._0_4_ = auVar143._0_4_ * fVar45;
    auVar95._4_4_ = auVar143._4_4_ * fVar8;
    auVar95._8_4_ = auVar143._8_4_ * fVar13;
    auVar95._12_4_ = auVar143._12_4_ * fVar17;
    auVar110._0_4_ = local_240 * fVar146;
    auVar110._4_4_ = local_240 * fVar149;
    auVar110._8_4_ = local_240 * fVar150;
    auVar110._12_4_ = local_240 * fVar151;
    auVar36 = vsubps_avx(auVar95,auVar110);
    auVar111._0_4_ = auVar143._0_4_ * fVar131;
    auVar111._4_4_ = auVar143._4_4_ * fVar139;
    auVar111._8_4_ = auVar143._8_4_ * fVar140;
    auVar111._12_4_ = auVar143._12_4_ * fVar141;
    auVar160._0_4_ = fVar146 * local_2a0;
    auVar160._4_4_ = fVar149 * local_2a0;
    auVar160._8_4_ = fVar150 * local_2a0;
    auVar160._12_4_ = fVar151 * local_2a0;
    auVar34 = vsubps_avx(auVar111,auVar160);
    auVar65._0_4_ =
         auVar33._0_4_ * auVar33._0_4_ +
         auVar36._0_4_ * auVar36._0_4_ + auVar34._0_4_ * auVar34._0_4_;
    auVar65._4_4_ =
         auVar33._4_4_ * auVar33._4_4_ +
         auVar36._4_4_ * auVar36._4_4_ + auVar34._4_4_ * auVar34._4_4_;
    auVar65._8_4_ =
         auVar33._8_4_ * auVar33._8_4_ +
         auVar36._8_4_ * auVar36._8_4_ + auVar34._8_4_ * auVar34._8_4_;
    auVar65._12_4_ =
         auVar33._12_4_ * auVar33._12_4_ +
         auVar36._12_4_ * auVar36._12_4_ + auVar34._12_4_ * auVar34._12_4_;
    auVar96._0_4_ = (float)local_480._0_4_ * (float)local_480._0_4_ * fVar92;
    auVar96._4_4_ = (float)local_480._4_4_ * (float)local_480._4_4_ * fVar103;
    auVar96._8_4_ = fStack_478 * fStack_478 * fVar104;
    auVar96._12_4_ = fStack_474 * fStack_474 * fVar105;
    auVar33 = vcmpps_avx(auVar65,auVar96,1);
    auVar148._8_4_ = 0x7f800000;
    auVar148._0_8_ = 0x7f8000007f800000;
    auVar148._12_4_ = 0x7f800000;
    auVar97._0_4_ = fVar122 * -fVar146;
    auVar97._4_4_ = fVar128 * -fVar149;
    auVar97._8_4_ = fVar129 * -fVar150;
    auVar97._12_4_ = fVar130 * -fVar151;
    auVar36 = vblendvps_avx(auVar148,auVar97,auVar33);
    auVar33 = vandnps_avx(*(undefined1 (*) [16])(mm_lookupmask_ps + (ulong)line->leftExists * 0x10),
                          auVar59);
    local_370 = vblendvps_avx(auVar148,auVar36,auVar33);
    local_290._0_4_ = auVar60._0_4_;
    local_290._4_4_ = auVar60._4_4_;
    fStack_288 = auVar60._8_4_;
    fStack_284 = auVar60._12_4_;
    fVar146 = (float)local_290._0_4_ * fVar91 + fVar90 * auVar62._0_4_ + auVar70._0_4_ * fVar82;
    fVar149 = (float)local_290._4_4_ * fVar162 + fVar58 * auVar62._4_4_ + auVar70._4_4_ * fVar57;
    fVar150 = fStack_288 * fVar12 + fVar11 * auVar62._8_4_ + auVar70._8_4_ * fVar10;
    fVar151 = fStack_284 * fVar16 + fVar15 * auVar62._12_4_ + auVar70._12_4_ * fVar14;
    auVar98._0_4_ = auVar143._0_4_ * (float)local_290._0_4_;
    auVar98._4_4_ = auVar143._4_4_ * (float)local_290._4_4_;
    auVar98._8_4_ = auVar143._8_4_ * fStack_288;
    auVar98._12_4_ = auVar143._12_4_ * fStack_284;
    auVar36._0_4_ = auVar143._0_4_ * auVar62._0_4_;
    auVar36._4_4_ = auVar143._4_4_ * auVar62._4_4_;
    auVar36._8_4_ = auVar143._8_4_ * auVar62._8_4_;
    auVar36._12_4_ = auVar143._12_4_ * auVar62._12_4_;
    auVar76._0_4_ = auVar143._0_4_ * auVar70._0_4_;
    auVar76._4_4_ = auVar143._4_4_ * auVar70._4_4_;
    auVar76._8_4_ = auVar143._8_4_ * auVar70._8_4_;
    auVar76._12_4_ = auVar143._12_4_ * auVar70._12_4_;
    auVar112._0_4_ = (float)local_3d0._4_4_ * fVar146;
    auVar112._4_4_ = (float)local_3d0._4_4_ * fVar149;
    auVar112._8_4_ = (float)local_3d0._4_4_ * fVar150;
    auVar112._12_4_ = (float)local_3d0._4_4_ * fVar151;
    auVar33 = vsubps_avx(auVar98,auVar112);
    auVar113._0_4_ = local_240 * fVar146;
    auVar113._4_4_ = local_240 * fVar149;
    auVar113._8_4_ = local_240 * fVar150;
    auVar113._12_4_ = local_240 * fVar151;
    auVar36 = vsubps_avx(auVar36,auVar113);
    auVar114._0_4_ = local_2a0 * fVar146;
    auVar114._4_4_ = local_2a0 * fVar149;
    auVar114._8_4_ = local_2a0 * fVar150;
    auVar114._12_4_ = local_2a0 * fVar151;
    auVar34 = vsubps_avx(auVar76,auVar114);
    auVar37._0_4_ =
         auVar33._0_4_ * auVar33._0_4_ +
         auVar36._0_4_ * auVar36._0_4_ + auVar34._0_4_ * auVar34._0_4_;
    auVar37._4_4_ =
         auVar33._4_4_ * auVar33._4_4_ +
         auVar36._4_4_ * auVar36._4_4_ + auVar34._4_4_ * auVar34._4_4_;
    auVar37._8_4_ =
         auVar33._8_4_ * auVar33._8_4_ +
         auVar36._8_4_ * auVar36._8_4_ + auVar34._8_4_ * auVar34._8_4_;
    auVar37._12_4_ =
         auVar33._12_4_ * auVar33._12_4_ +
         auVar36._12_4_ * auVar36._12_4_ + auVar34._12_4_ * auVar34._12_4_;
    auVar77._0_4_ = auVar32._0_4_ * auVar32._0_4_ * fVar92;
    auVar77._4_4_ = auVar32._4_4_ * auVar32._4_4_ * fVar103;
    auVar77._8_4_ = auVar32._8_4_ * auVar32._8_4_ * fVar104;
    auVar77._12_4_ = auVar32._12_4_ * auVar32._12_4_ * fVar105;
    uVar22 = *(undefined4 *)(ray + k * 4 + 0x60);
    auVar99._4_4_ = uVar22;
    auVar99._0_4_ = uVar22;
    auVar99._8_4_ = uVar22;
    auVar99._12_4_ = uVar22;
    auVar33 = vandnps_avx(*(undefined1 (*) [16])(mm_lookupmask_ps + (ulong)line->rightExists * 0x10)
                          ,auVar59);
    auVar36 = vcmpps_avx(auVar37,auVar77,1);
    auVar50._0_4_ = fVar122 * -fVar146;
    auVar50._4_4_ = fVar128 * -fVar149;
    auVar50._8_4_ = fVar129 * -fVar150;
    auVar50._12_4_ = fVar130 * -fVar151;
    auVar36 = vblendvps_avx(auVar148,auVar50,auVar36);
    auVar33 = vblendvps_avx(auVar148,auVar36,auVar33);
    auVar47 = vminps_avx(local_370,auVar33);
    auVar36 = vmaxps_avx(local_370,auVar33);
    auVar32 = vminps_avx(local_2e0,auVar47);
    auVar33 = vcmpps_avx(auVar148,auVar36,0);
    auVar125._8_4_ = 0xff800000;
    auVar125._0_8_ = 0xff800000ff800000;
    auVar125._12_4_ = 0xff800000;
    auVar33 = vblendvps_avx(auVar36,auVar125,auVar33);
    auVar34 = vcmpps_avx(auVar32,auVar47,0);
    auVar36 = vcmpps_avx(auVar148,auVar47,0);
    auVar36 = vblendvps_avx(auVar47,auVar125,auVar36);
    auVar33 = vblendvps_avx(auVar36,auVar33,auVar34);
    local_190 = vmaxps_avx(local_3b0,auVar33);
    auVar51._0_4_ = fVar46 + auVar32._0_4_;
    auVar51._4_4_ = fVar56 + auVar32._4_4_;
    auVar51._8_4_ = fStack_438 + auVar32._8_4_;
    auVar51._12_4_ = fStack_434 + auVar32._12_4_;
    auVar33 = vcmpps_avx(auVar99,auVar51,2);
    uVar22 = *(undefined4 *)(ray + k * 4 + 0x100);
    auVar78._4_4_ = uVar22;
    auVar78._0_4_ = uVar22;
    auVar78._8_4_ = uVar22;
    auVar78._12_4_ = uVar22;
    auVar36 = vcmpps_avx(auVar51,auVar78,2);
    auVar33 = vandps_avx(auVar33,auVar36);
    auVar36 = vcmpps_avx(auVar148,auVar32,4);
    local_360 = vandps_avx(auVar33,auVar36);
    local_3f0._0_4_ = fVar46 + local_190._0_4_;
    local_3f0._4_4_ = fVar56 + local_190._4_4_;
    local_3f0._8_4_ = fStack_438 + local_190._8_4_;
    local_3f0._12_4_ = fStack_434 + local_190._12_4_;
    auVar33 = vcmpps_avx(auVar99,local_3f0,2);
    auVar36 = vcmpps_avx(local_3f0,auVar78,2);
    auVar33 = vandps_avx(auVar33,auVar36);
    auVar36 = vandps_avx(local_360,auVar59);
    auVar34 = vcmpps_avx(auVar125,local_190,4);
    auVar34 = vandps_avx(auVar59,auVar34);
    local_350 = vandps_avx(auVar33,auVar34);
    local_460 = vorps_avx(auVar36,local_350);
    if ((((local_460 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
         (local_460 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (local_460 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        local_460[0xf] < '\0') {
      auVar34 = vblendvps_avx(local_190,auVar32,auVar36);
      _local_290 = auVar155;
      auVar47 = vblendvps_avx(auVar155,auVar124,auVar36);
      auVar19._4_4_ = fVar41;
      auVar19._0_4_ = fVar30;
      auVar19._8_4_ = fVar43;
      auVar19._12_4_ = fVar44;
      local_480._0_4_ = fVar30 * fVar55 * (float)local_480._0_4_;
      local_480._4_4_ = fVar41 * fVar9 * (float)local_480._4_4_;
      fStack_478 = fVar43 * fVar31 * fStack_478;
      fStack_474 = fVar44 * fVar42 * fStack_474;
      auVar33 = vcmpps_avx(local_2e0,auVar34,0);
      auVar36 = vcmpps_avx(auVar34,local_3b0,0);
      auVar33 = vorps_avx(auVar33,auVar36);
      auVar33 = vandps_avx(auVar59,auVar33);
      auVar36 = vcmpps_avx(auVar34,local_370,0);
      auVar36 = vandps_avx(auVar59,auVar36);
      fVar31 = auVar34._0_4_;
      fVar42 = auVar34._4_4_;
      fVar92 = auVar34._8_4_;
      fVar103 = auVar34._12_4_;
      local_1a0 = fVar91 * (float)local_480._0_4_;
      fStack_19c = fVar162 * (float)local_480._4_4_;
      fStack_198 = fVar12 * fStack_478;
      fStack_194 = fVar16 * fStack_474;
      auVar66._0_4_ =
           fVar91 * (float)local_480._0_4_ +
           (float)local_230._0_4_ * (fVar31 * (float)local_3d0._4_4_ + fVar152);
      auVar66._4_4_ =
           fVar162 * (float)local_480._4_4_ +
           (float)local_230._4_4_ * (fVar42 * (float)local_3d0._4_4_ + fVar157);
      auVar66._8_4_ = fVar12 * fStack_478 + fStack_228 * (fVar92 * (float)local_3d0._4_4_ + fVar158)
      ;
      auVar66._12_4_ =
           fVar16 * fStack_474 + fStack_224 * (fVar103 * (float)local_3d0._4_4_ + fVar159);
      local_1c0 = fVar91 * fVar74;
      fStack_1bc = fVar162 * fVar79;
      fStack_1b8 = fVar12 * fVar80;
      fStack_1b4 = fVar16 * fVar81;
      fVar55 = auVar47._0_4_;
      auVar126._0_4_ = fVar91 * fVar74 * fVar55;
      fVar91 = auVar47._4_4_;
      auVar126._4_4_ = fVar162 * fVar79 * fVar91;
      fVar162 = auVar47._8_4_;
      auVar126._8_4_ = fVar12 * fVar80 * fVar162;
      fVar9 = auVar47._12_4_;
      auVar126._12_4_ = fVar16 * fVar81 * fVar9;
      auVar47 = vsubps_avx(auVar66,auVar126);
      local_1b0 = fVar90 * (float)local_480._0_4_;
      fStack_1ac = fVar58 * (float)local_480._4_4_;
      fStack_1a8 = fVar11 * fStack_478;
      fStack_1a4 = fVar15 * fStack_474;
      auVar127._0_4_ =
           fVar90 * (float)local_480._0_4_ + (fVar31 * local_240 + fVar45) * (float)local_230._0_4_;
      auVar127._4_4_ =
           fVar58 * (float)local_480._4_4_ + (fVar42 * local_240 + fVar8) * (float)local_230._4_4_;
      auVar127._8_4_ = fVar11 * fStack_478 + (fVar92 * local_240 + fVar13) * fStack_228;
      auVar127._12_4_ = fVar15 * fStack_474 + (fVar103 * local_240 + fVar17) * fStack_224;
      fStack_27c = fVar58 * fVar79;
      local_280 = fVar90 * fVar74;
      fStack_278 = fVar11 * fVar80;
      fStack_274 = fVar15 * fVar81;
      auVar137._0_4_ = fVar90 * fVar74 * fVar55;
      auVar137._4_4_ = fVar58 * fVar79 * fVar91;
      auVar137._8_4_ = fVar11 * fVar80 * fVar162;
      auVar137._12_4_ = fVar15 * fVar81 * fVar9;
      local_1e0._0_8_ = auVar69._0_8_ ^ 0x8000000080000000;
      local_1e0._8_4_ = -fVar12;
      local_1e0._12_4_ = -fVar16;
      auVar34 = vblendvps_avx(auVar69,local_1e0,auVar36);
      auVar59 = vsubps_avx(auVar127,auVar137);
      local_310 = vblendvps_avx(auVar34,auVar47,auVar33);
      local_200._0_8_ = local_260._0_8_ ^ 0x8000000080000000;
      local_200._8_4_ = -fVar11;
      local_200._12_4_ = -fVar15;
      auVar34 = vblendvps_avx(local_260,local_200,auVar36);
      local_300 = vblendvps_avx(auVar34,auVar59,auVar33);
      auVar34 = vrcpps_avx(auVar19);
      local_2d0 = auVar34._0_4_;
      auVar72._0_4_ = local_2d0 * fVar30;
      fStack_2cc = auVar34._4_4_;
      auVar72._4_4_ = fStack_2cc * fVar41;
      fStack_2c8 = auVar34._8_4_;
      auVar72._8_4_ = fStack_2c8 * fVar43;
      fStack_2c4 = auVar34._12_4_;
      auVar72._12_4_ = fStack_2c4 * fVar44;
      auVar144._8_4_ = 0x3f800000;
      auVar144._0_8_ = 0x3f8000003f800000;
      auVar144._12_4_ = 0x3f800000;
      auVar34 = vsubps_avx(auVar144,auVar72);
      local_2d0 = local_2d0 + local_2d0 * auVar34._0_4_;
      fStack_2cc = fStack_2cc + fStack_2cc * auVar34._4_4_;
      fStack_2c8 = fStack_2c8 + fStack_2c8 * auVar34._8_4_;
      fStack_2c4 = fStack_2c4 + fStack_2c4 * auVar34._12_4_;
      auVar20._4_4_ = local_2a0;
      auVar20._0_4_ = local_2a0;
      auVar20._8_4_ = local_2a0;
      auVar20._12_4_ = local_2a0;
      local_1d0 = fVar82 * (float)local_480._0_4_;
      fStack_1cc = fVar57 * (float)local_480._4_4_;
      fStack_1c8 = fVar10 * fStack_478;
      fStack_1c4 = fVar14 * fStack_474;
      auVar73._0_4_ =
           fVar82 * (float)local_480._0_4_ + (float)local_230._0_4_ * (fVar131 + local_2a0 * fVar31)
      ;
      auVar73._4_4_ =
           fVar57 * (float)local_480._4_4_ + (float)local_230._4_4_ * (fVar139 + local_2a0 * fVar42)
      ;
      auVar73._8_4_ = fVar10 * fStack_478 + fStack_228 * (fVar140 + local_2a0 * fVar92);
      auVar73._12_4_ = fVar14 * fStack_474 + fStack_224 * (fVar141 + local_2a0 * fVar103);
      local_270 = fVar82 * fVar74;
      fStack_26c = fVar57 * fVar79;
      fStack_268 = fVar10 * fVar80;
      fStack_264 = fVar14 * fVar81;
      auVar84._0_4_ = fVar55 * fVar82 * fVar74;
      auVar84._4_4_ = fVar91 * fVar57 * fVar79;
      auVar84._8_4_ = fVar162 * fVar10 * fVar80;
      auVar84._12_4_ = fVar9 * fVar14 * fVar81;
      auVar47 = vsubps_avx(auVar73,auVar84);
      local_210._0_8_ = local_2b0._0_8_ ^ 0x8000000080000000;
      local_210._8_4_ = -fVar10;
      local_210._12_4_ = -fVar14;
      auVar34 = vblendvps_avx(local_2b0,local_210,auVar36);
      local_2f0 = vblendvps_avx(auVar34,auVar47,auVar33);
      local_1f0 = vandnps_avx(auVar36,auVar144);
      auVar52._0_4_ = fVar55 * local_2d0;
      auVar52._4_4_ = fVar91 * fStack_2cc;
      auVar52._8_4_ = fVar162 * fStack_2c8;
      auVar52._12_4_ = fVar9 * fStack_2c4;
      local_340 = vblendvps_avx(local_1f0,auVar52,auVar33);
      auVar38._0_4_ = fVar31 + fVar46;
      auVar38._4_4_ = fVar42 + fVar56;
      auVar38._8_4_ = fVar92 + fStack_438;
      auVar38._12_4_ = fVar103 + fStack_434;
      local_330 = ZEXT816(0) << 0x20;
      local_320 = auVar38;
      auVar100._8_4_ = 0x7f800000;
      auVar100._0_8_ = 0x7f8000007f800000;
      auVar100._12_4_ = 0x7f800000;
      auVar102 = ZEXT1664(auVar100);
      auVar33 = vblendvps_avx(auVar100,auVar38,local_460);
      auVar36 = vshufps_avx(auVar33,auVar33,0xb1);
      auVar36 = vminps_avx(auVar36,auVar33);
      auVar34 = vshufpd_avx(auVar36,auVar36,1);
      auVar36 = vminps_avx(auVar34,auVar36);
      auVar33 = vcmpps_avx(auVar33,auVar36,0);
      auVar34 = local_460 & auVar33;
      auVar36 = vpcmpeqd_avx(auVar36,auVar36);
      auVar121 = ZEXT1664(_local_3d0);
      auVar156 = ZEXT1664(auVar20);
      auVar116 = ZEXT1664(local_260);
      auVar89 = ZEXT1664(local_2b0);
      auVar145 = ZEXT1664(_local_3e0);
      auVar161 = ZEXT1664(local_2c0);
      if ((((auVar34 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
           (auVar34 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar34 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar34[0xf] < '\0'
         ) {
        auVar36 = auVar33;
      }
      auVar33 = vandps_avx(local_460,auVar36);
      uVar25 = vmovmskps_avx(auVar33);
      lVar28 = 0;
      if (uVar25 != 0) {
        for (; (uVar25 >> lVar28 & 1) == 0; lVar28 = lVar28 + 1) {
        }
      }
      uVar25 = 1 << ((byte)k & 0x1f);
      pauVar27 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)((int)uVar25 >> 4) * 0x10);
      auVar67 = vcmpps_avx(ZEXT1632(auVar20),ZEXT1632(auVar20),0xf);
      auVar138 = ZEXT3264(auVar67);
      local_448 = context;
      local_430 = local_460;
      local_3c0 = pSVar26;
      local_3b8 = ray;
      while( true ) {
        auVar34 = auVar116._0_16_;
        auVar36 = auVar102._0_16_;
        local_380 = &local_180;
        local_3a0 = local_420;
        auVar47 = auVar121._0_16_;
        auVar59 = auVar145._0_16_;
        auVar32 = auVar156._0_16_;
        auVar33 = auVar89._0_16_;
        uVar1 = *(uint *)(local_220 + lVar28 * 4);
        pRVar23 = (RayHitK<8> *)(ulong)uVar1;
        pGVar5 = (pSVar26->geometries).items[(long)pRVar23].ptr;
        if ((pGVar5->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
          *(undefined4 *)(local_460 + lVar28 * 4) = 0;
        }
        else {
          auVar48 = auVar161._0_16_;
          if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
             (pGVar5->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
            uVar22 = *(undefined4 *)(local_340 + lVar28 * 4);
            uVar21 = *(undefined4 *)(local_330 + lVar28 * 4);
            uVar2 = *(uint *)(local_320 + lVar28 * 4);
            *(uint *)(ray + k * 4 + 0x100) = uVar2;
            *(undefined4 *)(ray + k * 4 + 0x180) = *(undefined4 *)(local_310 + lVar28 * 4);
            *(undefined4 *)(ray + k * 4 + 0x1a0) = *(undefined4 *)(local_300 + lVar28 * 4);
            *(undefined4 *)(ray + k * 4 + 0x1c0) = *(undefined4 *)(local_2f0 + lVar28 * 4);
            *(undefined4 *)(ray + k * 4 + 0x1e0) = uVar22;
            *(undefined4 *)(ray + k * 4 + 0x200) = uVar21;
            *(uint *)(ray + k * 4 + 0x220) = (line->primIDs).field_0.i[lVar28];
            *(uint *)(ray + k * 4 + 0x240) = uVar1;
            *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
            uVar22 = 0;
            *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
            goto LAB_0087f70d;
          }
          local_120 = *(undefined4 *)(local_340 + lVar28 * 4);
          local_100 = *(undefined4 *)(local_330 + lVar28 * 4);
          local_e0 = (line->primIDs).field_0.i[lVar28];
          local_180._4_4_ = *(undefined4 *)(local_310 + lVar28 * 4);
          uVar22 = *(undefined4 *)(local_300 + lVar28 * 4);
          local_160._4_4_ = uVar22;
          local_160._0_4_ = uVar22;
          local_160._8_4_ = uVar22;
          local_160._12_4_ = uVar22;
          local_160._16_4_ = uVar22;
          local_160._20_4_ = uVar22;
          local_160._24_4_ = uVar22;
          local_160._28_4_ = uVar22;
          auStack_b0 = vpshufd_avx(ZEXT416(uVar1),0);
          local_140._4_4_ = *(undefined4 *)(local_2f0 + lVar28 * 4);
          local_180._0_4_ = local_180._4_4_;
          local_180._8_4_ = local_180._4_4_;
          local_180._12_4_ = local_180._4_4_;
          local_180._16_4_ = local_180._4_4_;
          local_180._20_4_ = local_180._4_4_;
          local_180._24_4_ = local_180._4_4_;
          local_180._28_4_ = local_180._4_4_;
          local_140._0_4_ = local_140._4_4_;
          local_140._8_4_ = local_140._4_4_;
          local_140._12_4_ = local_140._4_4_;
          local_140._16_4_ = local_140._4_4_;
          local_140._20_4_ = local_140._4_4_;
          local_140._24_4_ = local_140._4_4_;
          local_140._28_4_ = local_140._4_4_;
          uStack_11c = local_120;
          uStack_118 = local_120;
          uStack_114 = local_120;
          uStack_110 = local_120;
          uStack_10c = local_120;
          uStack_108 = local_120;
          uStack_104 = local_120;
          uStack_fc = local_100;
          uStack_f8 = local_100;
          uStack_f4 = local_100;
          uStack_f0 = local_100;
          uStack_ec = local_100;
          uStack_e8 = local_100;
          uStack_e4 = local_100;
          uStack_dc = local_e0;
          uStack_d8 = local_e0;
          uStack_d4 = local_e0;
          uStack_d0 = local_e0;
          uStack_cc = local_e0;
          uStack_c8 = local_e0;
          uStack_c4 = local_e0;
          local_c0 = auStack_b0;
          uStack_9c = context->user->instID[0];
          local_a0 = uStack_9c;
          uStack_98 = uStack_9c;
          uStack_94 = uStack_9c;
          uStack_90 = uStack_9c;
          uStack_8c = uStack_9c;
          uStack_88 = uStack_9c;
          uStack_84 = uStack_9c;
          uStack_7c = context->user->instPrimID[0];
          local_80 = uStack_7c;
          uStack_78 = uStack_7c;
          uStack_74 = uStack_7c;
          uStack_70 = uStack_7c;
          uStack_6c = uStack_7c;
          uStack_68 = uStack_7c;
          uStack_64 = uStack_7c;
          uVar1 = *(uint *)(ray + k * 4 + 0x100);
          *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_320 + lVar28 * 4);
          local_420 = *(undefined1 (*) [16])(mm_lookupmask_ps + ((uVar25 & 0xf) << 4));
          local_410 = *pauVar27;
          local_398 = pGVar5->userPtr;
          local_390 = context->user;
          local_378 = 8;
          pRVar23 = (RayHitK<8> *)pGVar5->intersectionFilterN;
          local_440 = pauVar27;
          local_388 = ray;
          auVar33 = ZEXT416(uVar1);
          if (pRVar23 != (RayHitK<8> *)0x0) {
            local_430 = ZEXT416(uVar1);
            auVar67 = ZEXT1632(auVar138._0_16_);
            pRVar23 = (RayHitK<8> *)(*(code *)pRVar23)(&local_3a0);
            auVar67 = vcmpps_avx(auVar67,auVar67,0xf);
            auVar138 = ZEXT3264(auVar67);
            auVar161 = ZEXT1664(local_2c0);
            auVar145 = ZEXT1664(_local_3e0);
            auVar89 = ZEXT1664(local_2b0);
            auVar116 = ZEXT1664(local_260);
            auVar156 = ZEXT1664(CONCAT412(fStack_294,
                                          CONCAT48(fStack_298,CONCAT44(fStack_29c,local_2a0))));
            auVar121 = ZEXT1664(_local_3d0);
            auVar102 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
            context = local_448;
            ray = local_3b8;
            pSVar26 = local_3c0;
            auVar33 = local_430;
          }
          auVar36 = vpcmpeqd_avx(local_420,ZEXT816(0) << 0x40);
          auVar34 = vpcmpeqd_avx(local_410,ZEXT816(0) << 0x40);
          auVar67._16_16_ = auVar34;
          auVar67._0_16_ = auVar36;
          auVar67 = auVar138._0_32_ & ~auVar67;
          if ((((((((auVar67 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar67 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar67 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar67 >> 0x7f,0) == '\0') &&
                (auVar67 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar67 >> 0xbf,0) == '\0') &&
              (auVar67 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar67[0x1f]) {
            auVar39._0_4_ = auVar138._0_4_ ^ auVar36._0_4_;
            auVar39._4_4_ = auVar138._4_4_ ^ auVar36._4_4_;
            auVar39._8_4_ = auVar138._8_4_ ^ auVar36._8_4_;
            auVar39._12_4_ = auVar138._12_4_ ^ auVar36._12_4_;
            auVar39._16_4_ = auVar138._16_4_ ^ auVar34._0_4_;
            auVar39._20_4_ = auVar138._20_4_ ^ auVar34._4_4_;
            auVar39._24_4_ = auVar138._24_4_ ^ auVar34._8_4_;
            auVar39._28_4_ = auVar138._28_4_ ^ auVar34._12_4_;
            pauVar27 = local_440;
          }
          else {
            pRVar23 = (RayHitK<8> *)context->args->filter;
            if ((pRVar23 != (RayHitK<8> *)0x0) &&
               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                 RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar5->field_8).field_0x2 & 0x40) != 0)))) {
              auVar67 = ZEXT1632(auVar138._0_16_);
              local_430 = auVar33;
              pRVar23 = (RayHitK<8> *)(*(code *)pRVar23)(&local_3a0);
              auVar67 = vcmpps_avx(auVar67,auVar67,0xf);
              auVar138 = ZEXT3264(auVar67);
              auVar161 = ZEXT1664(local_2c0);
              auVar145 = ZEXT1664(_local_3e0);
              auVar89 = ZEXT1664(local_2b0);
              auVar116 = ZEXT1664(local_260);
              auVar156 = ZEXT1664(CONCAT412(fStack_294,
                                            CONCAT48(fStack_298,CONCAT44(fStack_29c,local_2a0))));
              auVar121 = ZEXT1664(_local_3d0);
              auVar102 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
              context = local_448;
              pSVar26 = local_3c0;
              auVar33 = local_430;
            }
            auVar36 = vpcmpeqd_avx(local_420,ZEXT816(0) << 0x40);
            auVar34 = vpcmpeqd_avx(local_410,ZEXT816(0) << 0x40);
            auVar53._16_16_ = auVar34;
            auVar53._0_16_ = auVar36;
            auVar39._0_4_ = auVar138._0_4_ ^ auVar36._0_4_;
            auVar39._4_4_ = auVar138._4_4_ ^ auVar36._4_4_;
            auVar39._8_4_ = auVar138._8_4_ ^ auVar36._8_4_;
            auVar39._12_4_ = auVar138._12_4_ ^ auVar36._12_4_;
            auVar39._16_4_ = auVar138._16_4_ ^ auVar34._0_4_;
            auVar39._20_4_ = auVar138._20_4_ ^ auVar34._4_4_;
            auVar39._24_4_ = auVar138._24_4_ ^ auVar34._8_4_;
            auVar39._28_4_ = auVar138._28_4_ ^ auVar34._12_4_;
            auVar67 = auVar138._0_32_ & ~auVar53;
            pauVar27 = local_440;
            if ((((((((auVar67 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar67 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar67 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar67 >> 0x7f,0) != '\0') ||
                  (auVar67 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar67 >> 0xbf,0) != '\0') ||
                (auVar67 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar67[0x1f] < '\0') {
              auVar67 = vmaskmovps_avx(auVar39,*local_380);
              *(undefined1 (*) [32])(local_388 + 0x180) = auVar67;
              auVar67 = vmaskmovps_avx(auVar39,local_380[1]);
              *(undefined1 (*) [32])(local_388 + 0x1a0) = auVar67;
              auVar67 = vmaskmovps_avx(auVar39,local_380[2]);
              *(undefined1 (*) [32])(local_388 + 0x1c0) = auVar67;
              auVar67 = vmaskmovps_avx(auVar39,local_380[3]);
              *(undefined1 (*) [32])(local_388 + 0x1e0) = auVar67;
              auVar67 = vmaskmovps_avx(auVar39,local_380[4]);
              *(undefined1 (*) [32])(local_388 + 0x200) = auVar67;
              auVar67 = vmaskmovps_avx(auVar39,local_380[5]);
              *(undefined1 (*) [32])(local_388 + 0x220) = auVar67;
              auVar67 = vmaskmovps_avx(auVar39,local_380[6]);
              *(undefined1 (*) [32])(local_388 + 0x240) = auVar67;
              auVar67 = vmaskmovps_avx(auVar39,local_380[7]);
              *(undefined1 (*) [32])(local_388 + 0x260) = auVar67;
              auVar67 = vmaskmovps_avx(auVar39,local_380[8]);
              *(undefined1 (*) [32])(local_388 + 0x280) = auVar67;
              pRVar23 = local_388;
            }
          }
          if ((((((((auVar39 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar39 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar39 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar39 >> 0x7f,0) == '\0') &&
                (auVar39 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar39 >> 0xbf,0) == '\0') &&
              (auVar39 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar39[0x1f]) {
            *(int *)(ray + k * 4 + 0x100) = auVar33._0_4_;
          }
          else {
            auVar33 = ZEXT416(*(uint *)(ray + k * 4 + 0x100));
          }
          *(undefined4 *)(local_460 + lVar28 * 4) = 0;
          auVar33 = vshufps_avx(auVar33,auVar33,0);
          auVar33 = vcmpps_avx(auVar38,auVar33,2);
          local_460 = vandps_avx(auVar33,local_460);
        }
        uVar22 = (undefined4)((ulong)pRVar23 >> 0x20);
        auVar34 = auVar116._0_16_;
        auVar36 = auVar102._0_16_;
        auVar47 = auVar121._0_16_;
        auVar59 = auVar145._0_16_;
        auVar32 = auVar156._0_16_;
        auVar33 = auVar89._0_16_;
        if ((((local_460 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
             (local_460 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            (local_460 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            -1 < local_460[0xf]) break;
        auVar33 = vblendvps_avx(auVar36,auVar38,local_460);
        auVar36 = vshufps_avx(auVar33,auVar33,0xb1);
        auVar36 = vminps_avx(auVar36,auVar33);
        auVar34 = vshufpd_avx(auVar36,auVar36,1);
        auVar36 = vminps_avx(auVar34,auVar36);
        auVar36 = vcmpps_avx(auVar33,auVar36,0);
        auVar34 = local_460 & auVar36;
        auVar33 = local_460;
        if ((((auVar34 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
             (auVar34 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar34 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            auVar34[0xf] < '\0') {
          auVar33 = vandps_avx(auVar36,local_460);
        }
        uVar21 = vmovmskps_avx(auVar33);
        lVar28 = 0;
        if (CONCAT44(uVar22,uVar21) != 0) {
          for (; (CONCAT44(uVar22,uVar21) >> lVar28 & 1) == 0; lVar28 = lVar28 + 1) {
          }
        }
      }
      auVar48 = auVar161._0_16_;
      uVar2 = *(uint *)(ray + k * 4 + 0x100);
LAB_0087f70d:
      auVar89 = ZEXT464(uVar2);
      auVar60 = vshufps_avx(ZEXT416(uVar2),ZEXT416(uVar2),0);
      auVar60 = vcmpps_avx(local_3f0,auVar60,2);
      auVar60 = vandps_avx(auVar60,local_360);
      auVar61 = local_350 & auVar60;
      if ((((auVar61 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
           (auVar61 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar61 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar61[0xf] < '\0'
         ) {
        auVar116 = ZEXT1664(auVar36);
        auVar61 = vcmpps_avx(local_190,local_370,0);
        auVar69 = vblendvps_avx(auVar69,local_1e0,auVar61);
        auVar34 = vblendvps_avx(auVar34,local_200,auVar61);
        auVar33 = vblendvps_avx(auVar33,local_210,auVar61);
        auVar61 = vcmpps_avx(local_190,local_2e0,0);
        auVar62 = vcmpps_avx(local_190,local_3b0,0);
        auVar61 = vorps_avx(auVar61,auVar62);
        fVar82 = local_190._0_4_;
        fVar90 = local_190._4_4_;
        fVar91 = local_190._8_4_;
        fVar45 = local_190._12_4_;
        auVar85._0_4_ =
             (float)local_230._0_4_ * (auVar47._0_4_ * fVar82 + (float)local_250._0_4_) + local_1a0;
        auVar85._4_4_ =
             (float)local_230._4_4_ * (auVar47._4_4_ * fVar90 + (float)local_250._4_4_) + fStack_19c
        ;
        auVar85._8_4_ = fStack_228 * (auVar47._8_4_ * fVar91 + fStack_248) + fStack_198;
        auVar85._12_4_ = fStack_224 * (auVar47._12_4_ * fVar45 + fStack_244) + fStack_194;
        auVar101._0_4_ = (float)local_230._0_4_ * (auVar59._0_4_ + fVar82 * local_240) + local_1b0;
        auVar101._4_4_ = (float)local_230._4_4_ * (auVar59._4_4_ + fVar90 * fStack_23c) + fStack_1ac
        ;
        auVar101._8_4_ = fStack_228 * (auVar59._8_4_ + fVar91 * fStack_238) + fStack_1a8;
        auVar101._12_4_ = fStack_224 * (auVar59._12_4_ + fVar45 * fStack_234) + fStack_1a4;
        auVar115._0_4_ =
             (float)local_230._0_4_ * (auVar48._0_4_ + auVar32._0_4_ * fVar82) + local_1d0;
        auVar115._4_4_ =
             (float)local_230._4_4_ * (auVar48._4_4_ + auVar32._4_4_ * fVar90) + fStack_1cc;
        auVar115._8_4_ = fStack_228 * (auVar48._8_4_ + auVar32._8_4_ * fVar91) + fStack_1c8;
        auVar115._12_4_ = fStack_224 * (auVar48._12_4_ + auVar32._12_4_ * fVar45) + fStack_1c4;
        auVar120._0_4_ = (float)local_290._0_4_ * local_1c0;
        auVar120._4_4_ = (float)local_290._4_4_ * fStack_1bc;
        auVar120._8_4_ = fStack_288 * fStack_1b8;
        auVar120._12_4_ = fStack_284 * fStack_1b4;
        auVar47 = vsubps_avx(auVar85,auVar120);
        local_310 = vblendvps_avx(auVar69,auVar47,auVar61);
        auVar86._0_4_ = (float)local_290._0_4_ * local_280;
        auVar86._4_4_ = (float)local_290._4_4_ * fStack_27c;
        auVar86._8_4_ = fStack_288 * fStack_278;
        auVar86._12_4_ = fStack_284 * fStack_274;
        auVar69 = vsubps_avx(auVar101,auVar86);
        local_300 = vblendvps_avx(auVar34,auVar69,auVar61);
        auVar87._0_4_ = (float)local_290._0_4_ * local_270;
        auVar87._4_4_ = (float)local_290._4_4_ * fStack_26c;
        auVar87._8_4_ = fStack_288 * fStack_268;
        auVar87._12_4_ = fStack_284 * fStack_264;
        auVar69 = vsubps_avx(auVar115,auVar87);
        local_2f0 = vblendvps_avx(auVar33,auVar69,auVar61);
        auVar88._0_4_ = (float)local_290._0_4_ * local_2d0;
        auVar88._4_4_ = (float)local_290._4_4_ * fStack_2cc;
        auVar88._8_4_ = fStack_288 * fStack_2c8;
        auVar88._12_4_ = fStack_284 * fStack_2c4;
        local_340 = vblendvps_avx(local_1f0,auVar88,auVar61);
        local_460 = vandps_avx(local_350,auVar60);
        auVar102 = ZEXT464(0) << 0x20;
        local_330 = ZEXT416(0) << 0x20;
        local_320 = local_3f0;
        auVar33 = vblendvps_avx(auVar36,local_3f0,local_460);
        auVar36 = vshufps_avx(auVar33,auVar33,0xb1);
        auVar36 = vminps_avx(auVar36,auVar33);
        auVar69 = vshufpd_avx(auVar36,auVar36,1);
        auVar36 = vminps_avx(auVar69,auVar36);
        auVar36 = vcmpps_avx(auVar33,auVar36,0);
        pSVar26 = context->scene;
        auVar69 = local_460 & auVar36;
        auVar33 = local_460;
        if ((((auVar69 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
             (auVar69 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar69 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            auVar69[0xf] < '\0') {
          auVar33 = vandps_avx(auVar36,local_460);
        }
        uVar21 = vmovmskps_avx(auVar33);
        lVar28 = 0;
        if (CONCAT44(uVar22,uVar21) != 0) {
          for (; (CONCAT44(uVar22,uVar21) >> lVar28 & 1) == 0; lVar28 = lVar28 + 1) {
          }
        }
        auVar67 = vcmpps_avx(ZEXT1632(auVar120),ZEXT1632(auVar120),0xf);
        auVar121 = ZEXT3264(auVar67);
        do {
          local_380 = &local_180;
          local_3a0 = local_420;
          uVar1 = *(uint *)(local_220 + lVar28 * 4);
          pRVar23 = (RayHitK<8> *)(ulong)uVar1;
          pGVar5 = (pSVar26->geometries).items[(long)pRVar23].ptr;
          if ((pGVar5->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
            *(undefined4 *)(local_460 + lVar28 * 4) = 0;
          }
          else {
            if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
               (pGVar5->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
              uVar22 = *(undefined4 *)(local_340 + lVar28 * 4);
              uVar21 = *(undefined4 *)(local_330 + lVar28 * 4);
              *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_320 + lVar28 * 4);
              *(undefined4 *)(ray + k * 4 + 0x180) = *(undefined4 *)(local_310 + lVar28 * 4);
              *(undefined4 *)(ray + k * 4 + 0x1a0) = *(undefined4 *)(local_300 + lVar28 * 4);
              *(undefined4 *)(ray + k * 4 + 0x1c0) = *(undefined4 *)(local_2f0 + lVar28 * 4);
              *(undefined4 *)(ray + k * 4 + 0x1e0) = uVar22;
              *(undefined4 *)(ray + k * 4 + 0x200) = uVar21;
              *(uint *)(ray + k * 4 + 0x220) = (line->primIDs).field_0.i[lVar28];
              *(uint *)(ray + k * 4 + 0x240) = uVar1;
              *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
              *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
              return;
            }
            local_120 = *(undefined4 *)(local_340 + lVar28 * 4);
            local_100 = *(undefined4 *)(local_330 + lVar28 * 4);
            auStack_b0 = vpshufd_avx(ZEXT416(uVar1),0);
            local_e0 = (line->primIDs).field_0.i[lVar28];
            uVar22 = *(undefined4 *)(local_310 + lVar28 * 4);
            local_180._4_4_ = uVar22;
            local_180._0_4_ = uVar22;
            local_180._8_4_ = uVar22;
            local_180._12_4_ = uVar22;
            local_180._16_4_ = uVar22;
            local_180._20_4_ = uVar22;
            local_180._24_4_ = uVar22;
            local_180._28_4_ = uVar22;
            uVar22 = *(undefined4 *)(local_300 + lVar28 * 4);
            local_160._4_4_ = uVar22;
            local_160._0_4_ = uVar22;
            local_160._8_4_ = uVar22;
            local_160._12_4_ = uVar22;
            local_160._16_4_ = uVar22;
            local_160._20_4_ = uVar22;
            local_160._24_4_ = uVar22;
            local_160._28_4_ = uVar22;
            uVar22 = *(undefined4 *)(local_2f0 + lVar28 * 4);
            local_140._4_4_ = uVar22;
            local_140._0_4_ = uVar22;
            local_140._8_4_ = uVar22;
            local_140._12_4_ = uVar22;
            local_140._16_4_ = uVar22;
            local_140._20_4_ = uVar22;
            local_140._24_4_ = uVar22;
            local_140._28_4_ = uVar22;
            uStack_11c = local_120;
            uStack_118 = local_120;
            uStack_114 = local_120;
            uStack_110 = local_120;
            uStack_10c = local_120;
            uStack_108 = local_120;
            uStack_104 = local_120;
            uStack_fc = local_100;
            uStack_f8 = local_100;
            uStack_f4 = local_100;
            uStack_f0 = local_100;
            uStack_ec = local_100;
            uStack_e8 = local_100;
            uStack_e4 = local_100;
            uStack_dc = local_e0;
            uStack_d8 = local_e0;
            uStack_d4 = local_e0;
            uStack_d0 = local_e0;
            uStack_cc = local_e0;
            uStack_c8 = local_e0;
            uStack_c4 = local_e0;
            local_c0 = auStack_b0;
            uStack_9c = context->user->instID[0];
            local_a0 = uStack_9c;
            uStack_98 = uStack_9c;
            uStack_94 = uStack_9c;
            uStack_90 = uStack_9c;
            uStack_8c = uStack_9c;
            uStack_88 = uStack_9c;
            uStack_84 = uStack_9c;
            uStack_7c = context->user->instPrimID[0];
            local_80 = uStack_7c;
            uStack_78 = uStack_7c;
            uStack_74 = uStack_7c;
            uStack_70 = uStack_7c;
            uStack_6c = uStack_7c;
            uStack_68 = uStack_7c;
            uStack_64 = uStack_7c;
            *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_320 + lVar28 * 4);
            local_420 = *(undefined1 (*) [16])(mm_lookupmask_ps + ((uVar25 & 0xf) << 4));
            local_410 = *pauVar27;
            local_398 = pGVar5->userPtr;
            local_390 = context->user;
            local_378 = 8;
            pRVar23 = (RayHitK<8> *)pGVar5->intersectionFilterN;
            local_440 = pauVar27;
            local_388 = ray;
            if (pRVar23 != (RayHitK<8> *)0x0) {
              auVar67 = ZEXT1632(auVar121._0_16_);
              pRVar23 = (RayHitK<8> *)(*(code *)pRVar23)(&local_3a0);
              auVar67 = vcmpps_avx(auVar67,auVar67,0xf);
              auVar121 = ZEXT3264(auVar67);
              auVar102 = ZEXT1664(ZEXT816(0) << 0x40);
              auVar89 = ZEXT1664(auVar89._0_16_);
              context = local_448;
              ray = local_3b8;
            }
            auVar33 = vpcmpeqd_avx(local_420,auVar102._0_16_);
            auVar36 = vpcmpeqd_avx(local_410,auVar102._0_16_);
            auVar68._16_16_ = auVar36;
            auVar68._0_16_ = auVar33;
            auVar67 = auVar121._0_32_ & ~auVar68;
            if ((((((((auVar67 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar67 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar67 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar67 >> 0x7f,0) == '\0') &&
                  (auVar67 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar67 >> 0xbf,0) == '\0') &&
                (auVar67 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar67[0x1f]) {
              auVar40._0_4_ = auVar121._0_4_ ^ auVar33._0_4_;
              auVar40._4_4_ = auVar121._4_4_ ^ auVar33._4_4_;
              auVar40._8_4_ = auVar121._8_4_ ^ auVar33._8_4_;
              auVar40._12_4_ = auVar121._12_4_ ^ auVar33._12_4_;
              auVar40._16_4_ = auVar121._16_4_ ^ auVar36._0_4_;
              auVar40._20_4_ = auVar121._20_4_ ^ auVar36._4_4_;
              auVar40._24_4_ = auVar121._24_4_ ^ auVar36._8_4_;
              auVar40._28_4_ = auVar121._28_4_ ^ auVar36._12_4_;
              auVar116 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
              pauVar27 = local_440;
            }
            else {
              pRVar23 = (RayHitK<8> *)context->args->filter;
              if ((pRVar23 != (RayHitK<8> *)0x0) &&
                 (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                   RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar5->field_8).field_0x2 & 0x40) != 0)))) {
                auVar67 = ZEXT1632(auVar121._0_16_);
                pRVar23 = (RayHitK<8> *)(*(code *)pRVar23)(&local_3a0);
                auVar67 = vcmpps_avx(auVar67,auVar67,0xf);
                auVar121 = ZEXT3264(auVar67);
                auVar102 = ZEXT1664(ZEXT816(0) << 0x40);
                auVar89 = ZEXT1664(auVar89._0_16_);
                context = local_448;
              }
              auVar33 = vpcmpeqd_avx(local_420,auVar102._0_16_);
              auVar36 = vpcmpeqd_avx(local_410,auVar102._0_16_);
              auVar54._16_16_ = auVar36;
              auVar54._0_16_ = auVar33;
              auVar40._0_4_ = auVar121._0_4_ ^ auVar33._0_4_;
              auVar40._4_4_ = auVar121._4_4_ ^ auVar33._4_4_;
              auVar40._8_4_ = auVar121._8_4_ ^ auVar33._8_4_;
              auVar40._12_4_ = auVar121._12_4_ ^ auVar33._12_4_;
              auVar40._16_4_ = auVar121._16_4_ ^ auVar36._0_4_;
              auVar40._20_4_ = auVar121._20_4_ ^ auVar36._4_4_;
              auVar40._24_4_ = auVar121._24_4_ ^ auVar36._8_4_;
              auVar40._28_4_ = auVar121._28_4_ ^ auVar36._12_4_;
              auVar67 = auVar121._0_32_ & ~auVar54;
              auVar116 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
              pauVar27 = local_440;
              if ((((((((auVar67 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar67 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar67 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar67 >> 0x7f,0) != '\0') ||
                    (auVar67 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar67 >> 0xbf,0) != '\0') ||
                  (auVar67 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar67[0x1f] < '\0') {
                auVar67 = vmaskmovps_avx(auVar40,*local_380);
                *(undefined1 (*) [32])(local_388 + 0x180) = auVar67;
                auVar67 = vmaskmovps_avx(auVar40,local_380[1]);
                *(undefined1 (*) [32])(local_388 + 0x1a0) = auVar67;
                auVar67 = vmaskmovps_avx(auVar40,local_380[2]);
                *(undefined1 (*) [32])(local_388 + 0x1c0) = auVar67;
                auVar67 = vmaskmovps_avx(auVar40,local_380[3]);
                *(undefined1 (*) [32])(local_388 + 0x1e0) = auVar67;
                auVar67 = vmaskmovps_avx(auVar40,local_380[4]);
                *(undefined1 (*) [32])(local_388 + 0x200) = auVar67;
                auVar67 = vmaskmovps_avx(auVar40,local_380[5]);
                *(undefined1 (*) [32])(local_388 + 0x220) = auVar67;
                auVar67 = vmaskmovps_avx(auVar40,local_380[6]);
                *(undefined1 (*) [32])(local_388 + 0x240) = auVar67;
                auVar67 = vmaskmovps_avx(auVar40,local_380[7]);
                *(undefined1 (*) [32])(local_388 + 0x260) = auVar67;
                auVar67 = vmaskmovps_avx(auVar40,local_380[8]);
                *(undefined1 (*) [32])(local_388 + 0x280) = auVar67;
                pRVar23 = local_388;
              }
            }
            if ((((((((auVar40 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar40 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar40 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar40 >> 0x7f,0) == '\0') &&
                  (auVar40 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar40 >> 0xbf,0) == '\0') &&
                (auVar40 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar40[0x1f]) {
              *(int *)(ray + k * 4 + 0x100) = auVar89._0_4_;
            }
            else {
              auVar89 = ZEXT464(*(uint *)(ray + k * 4 + 0x100));
            }
            *(undefined4 *)(local_460 + lVar28 * 4) = 0;
            auVar33 = vshufps_avx(auVar89._0_16_,auVar89._0_16_,0);
            auVar33 = vcmpps_avx(local_3f0,auVar33,2);
            local_460 = vandps_avx(auVar33,local_460);
          }
          if ((((local_460 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
               (local_460 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (local_460 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              -1 < local_460[0xf]) {
            return;
          }
          auVar33 = vblendvps_avx(auVar116._0_16_,local_3f0,local_460);
          auVar36 = vshufps_avx(auVar33,auVar33,0xb1);
          auVar36 = vminps_avx(auVar36,auVar33);
          auVar69 = vshufpd_avx(auVar36,auVar36,1);
          auVar36 = vminps_avx(auVar69,auVar36);
          auVar36 = vcmpps_avx(auVar33,auVar36,0);
          auVar69 = local_460 & auVar36;
          auVar33 = local_460;
          if ((((auVar69 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar69 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar69 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar69[0xf] < '\0') {
            auVar33 = vandps_avx(auVar36,local_460);
          }
          uVar22 = vmovmskps_avx(auVar33);
          uVar24 = CONCAT44((int)((ulong)pRVar23 >> 0x20),uVar22);
          lVar28 = 0;
          if (uVar24 != 0) {
            for (; (uVar24 >> lVar28 & 1) == 0; lVar28 = lVar28 + 1) {
            }
          }
        } while( true );
      }
    }
  }
  return;
}

Assistant:

static __forceinline void intersect(const Precalculations& pre, RayHitK<K>& ray, size_t k, RayQueryContext* context,  const Primitive& line)
      {
        STAT3(normal.trav_prims,1,1,1);
        const LineSegments* geom = context->scene->get<LineSegments>(line.geomID());
        Vec4vf<M> v0,v1; 
        vbool<M> cL,cR;
        line.gather(v0,v1,cL,cR,geom,ray.time()[k]);
        const vbool<M> valid = line.valid();
        ConeCurveIntersectorK<M,K>::intersect(valid,ray,k,context,geom,pre,v0,v1,cL,cR,Intersect1KEpilogM<M,K,filter>(ray,k,context,line.geomID(),line.primID()));
      }